

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

bool xmrig::Buffer::fromHex(uint8_t *in,size_t size,uint8_t *out)

{
  uint8_t uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  
  if (size == 0) {
    return true;
  }
  uVar2 = 0;
  do {
    uVar1 = in[uVar2];
    bVar3 = uVar1 - 0x30;
    bVar5 = true;
    if (9 < bVar3) {
      if ((byte)(uVar1 + 0x9f) < 6) {
        bVar3 = uVar1 + 0xa9;
      }
      else {
        bVar3 = uVar1 - 0x37;
        bVar5 = (byte)(uVar1 + 0xbf) < 6;
        if (!bVar5) {
          bVar3 = 0;
        }
      }
    }
    uVar1 = in[uVar2 + 1];
    bVar4 = uVar1 - 0x30;
    if (9 < bVar4) {
      if ((byte)(uVar1 + 0x9f) < 6) {
        bVar4 = uVar1 + 0xa9;
      }
      else {
        if (5 < (byte)(uVar1 + 0xbf)) {
          out[uVar2 >> 1] = bVar3 << 4;
          return false;
        }
        bVar4 = uVar1 - 0x37;
      }
    }
    out[uVar2 >> 1] = bVar4 | bVar3 << 4;
    uVar2 = uVar2 + 2;
  } while ((bVar5 & uVar2 < size) != 0);
  return bVar5;
}

Assistant:

bool xmrig::Buffer::fromHex(const uint8_t *in, size_t size, uint8_t *out)
{
    bool error = false;
    for (size_t i = 0; i < size; i += 2) {
        out[i / 2] = static_cast<uint8_t>((hf_hex2bin(in[i], error) << 4) | hf_hex2bin(in[i + 1], error));

        if (error) {
            return false;
        }
    }

    return true;
}